

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseMessage.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::ParseMessageBuffer::PrintMessages
          (ParseMessageBuffer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringBuffer,uint flags)

{
  vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
  *this_00;
  bool bVar1;
  undefined1 local_68 [8];
  String msg;
  ParseMessage *message;
  iterator __end2;
  iterator __begin2;
  Messages *__range2;
  uint flags_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stringBuffer_local;
  ParseMessageBuffer *this_local;
  
  if (this->pMessages == (Messages *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(stringBuffer);
    this_00 = this->pMessages;
    __end2 = std::
             vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
             ::begin(this_00);
    message = (ParseMessage *)
              std::
              vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
              ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<SGParser::Generator::ParseMessage_*,_std::vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>_>
                                  *)&message);
      if (!bVar1) break;
      msg.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<SGParser::Generator::ParseMessage_*,_std::vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_68);
      PrintMessage(this,(String *)local_68,(ParseMessage *)msg.field_2._8_8_,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(stringBuffer,(value_type *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      __gnu_cxx::
      __normal_iterator<SGParser::Generator::ParseMessage_*,_std::vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ParseMessageBuffer::PrintMessages(std::vector<String>& stringBuffer,
                                       [[maybe_unused]] unsigned flags) const {
    // Make sure we have a valid message buffer
    if (!pMessages)
        return false;

    stringBuffer.clear();

    // Build the list of message strings
    for (const auto& message: *pMessages) {
        String msg;
        PrintMessage(msg, message, 0u);
        stringBuffer.push_back(msg);
    }

    return true;
}